

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdDmaState::emulate_mthd(MthdDmaState *this)

{
  uint32_t uVar1;
  undefined2 uVar2;
  uint uVar3;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  uVar3 = (this->super_SingleMthdTest).super_MthdTest.pobj[0] & 0xfff;
  if (((0x3d < uVar3) || ((0x2001000000000008U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) &&
     (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d & 0x800000) != 0)) {
    nv04_pgraph_blowup(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,2);
  }
  uVar2 = 0;
  if (uVar3 != 0x30) {
    uVar2 = (short)uVar1;
  }
  *(undefined2 *)
   ((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_dma + 2) = uVar2;
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t rval = val & 0xffff;
		int dcls = extr(pobj[0], 0, 12);
		if (dcls == 0x30)
			rval = 0;
		bool bad = false;
		if (dcls != 0x30 && dcls != 0x3d && dcls != 3)
			bad = true;
		if (bad && extr(exp.debug_d, 23, 1))
			nv04_pgraph_blowup(&exp, 2);
		insrt(exp.celsius_dma, 16, 16, rval);
	}